

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
MuteIRCCommand::trigger
          (MuteIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Channel *pCVar1;
  MuteIRCCommand *pMVar2;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> *args_1;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  size_t local_168;
  char *local_160;
  size_t local_148;
  char *local_140;
  size_t local_128;
  char *local_120;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  undefined1 local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  __sv_type local_a8;
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  _Alloc_hider local_80;
  char *local_78;
  undefined1 local_70 [8];
  Server *server;
  uint i;
  bool match;
  PlayerInfo *player;
  undefined1 auStack_50 [4];
  int type;
  undefined8 local_48;
  _Alloc_hider local_40;
  Channel *chan;
  IRC_Bot *source_local;
  MuteIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (MuteIRCCommand *)nick._M_len;
  pcVar7 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  chan = (Channel *)source;
  source_local = (IRC_Bot *)this;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  sVar3 = nick_local._M_len;
  pMVar2 = this_local;
  pCVar1 = chan;
  if (bVar4) {
    bVar8 = sv("Error: Too Few Parameters. Syntax: mute <player>",0x30);
    local_168 = bVar8._M_len;
    local_160 = bVar8._M_str;
    Jupiter::IRC::Client::sendNotice(pCVar1,pMVar2,sVar3,local_168,local_160);
  }
  else {
    _auStack_50 = nick_local._M_str;
    local_48 = pcVar7;
    local_40._M_p = (pointer)Jupiter::IRC::Client::getChannel(chan,nick_local._M_str,pcVar7);
    if (local_40._M_p != (pointer)0x0) {
      player._4_4_ = Jupiter::IRC::Client::Channel::getType();
      server._7_1_ = 0;
      server._0_4_ = 0;
      while( true ) {
        uVar6 = (ulong)(uint)server;
        RenX::getCore();
        uVar5 = RenX::Core::getServerCount();
        sVar3 = nick_local._M_len;
        pMVar2 = this_local;
        pCVar1 = chan;
        if (uVar6 == uVar5) break;
        uVar6 = RenX::getCore();
        local_70 = (undefined1  [8])RenX::Core::getServer(uVar6);
        uVar6 = RenX::Server::isLogChanType(SUB84(local_70,0));
        if ((uVar6 & 1) != 0) {
          server._7_1_ = 1;
          local_80._M_p = (pointer)parameters._M_len;
          local_78 = parameters._M_str;
          args_1 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
          _i = (pointer)RenX::Server::getPlayerByPartName
                                  (local_70,parameters._M_len,parameters._M_str);
          sVar3 = nick_local._M_len;
          pMVar2 = this_local;
          pCVar1 = chan;
          if (_i == (pointer)0x0) {
            bVar8 = sv("Error: Player not found.",0x18);
            local_128 = bVar8._M_len;
            local_120 = bVar8._M_str;
            Jupiter::IRC::Client::sendNotice(pCVar1,pMVar2,sVar3,local_128,local_120);
          }
          else {
            RenX::Server::mute((PlayerInfo *)local_70);
            pCVar1 = chan;
            local_98 = nick_local._M_str;
            aStack_90._M_allocated_capacity = (size_type)pcVar7;
            RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)local_e8);
            local_f8 = sv("\x03 has been muted.",0x11);
            jessilib::
            join<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_e8 + 0x20),(jessilib *)local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f8,args_1);
            local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)(local_e8 + 0x20));
            Jupiter::IRC::Client::sendMessage
                      (pCVar1,local_98,aStack_90._M_allocated_capacity,local_a8._M_len,
                       local_a8._M_str);
            std::__cxx11::string::~string((string *)(local_e8 + 0x20));
            std::__cxx11::string::~string((string *)local_e8);
          }
        }
        server._0_4_ = (uint)server + 1;
      }
      if ((server._7_1_ & 1) == 0) {
        bVar8 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_148 = bVar8._M_len;
        local_140 = bVar8._M_str;
        Jupiter::IRC::Client::sendNotice(pCVar1,pMVar2,sVar3,local_148,local_140);
      }
    }
  }
  return;
}

Assistant:

void MuteIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						server->mute(*player);
						source->sendMessage(channel, jessilib::join<std::string>(RenX::getFormattedPlayerName(*player), IRCCOLOR " has been muted."sv));
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: mute <player>"sv);
}